

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O1

void __thiscall
util_threadnames_tests::util_threadnames_test_rename_threaded::test_method
          (util_threadnames_test_rename_threaded *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  iterator iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int in_EDX;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar7;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined4 local_12c;
  size_t local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  char **local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined4 *local_e0;
  size_t *local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RenameEnMasse_abi_cxx11_(&names,(util_threadnames_tests *)0x64,in_EDX);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x39;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (char **)0xf6cf21;
  local_d8 = &local_128;
  local_128 = names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_e0 = &local_12c;
  local_12c = 100;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(names._M_t._M_impl.super__Rb_tree_header._M_node_count == 100);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
  ;
  local_c8 = "";
  local_48._8_8_ = &local_d8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abb70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_e0;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_120,1,2,REQUIRE,0xf754a1,(size_t)&local_d0,0x39,local_58,"100U",
             local_78);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_d8 = (size_t *)((ulong)local_d8 & 0xffffffff00000000);
  do {
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x3d;
    file_00.m_begin = (iterator)&local_140;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
               msg_00);
    util::ToString<int>((string *)local_78,(int *)&local_d8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_78,0,0,TEST_THREAD_NAME_BASE_abi_cxx11_,DAT_013c5648);
    local_58._0_8_ = (pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ == paVar4) {
      local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_48._8_8_ = *(long *)((long)&pbVar2->field_2 + 8);
      local_58._0_8_ = &local_48;
    }
    else {
      local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_58._8_8_ = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    _cVar7 = 0x761501;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&names._M_t,(key_type *)local_58);
    local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((_Rb_tree_header *)iVar3._M_node != &names._M_t._M_impl.super__Rb_tree_header);
    local_c0.m_message.px = (element_type *)0x0;
    local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_d0 = "names.find(TEST_THREAD_NAME_BASE + ToString(i)) != names.end()";
    local_c8 = "";
    local_120.m_empty = false;
    local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = &local_d0;
    local_160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_threadnames_tests.cpp"
    ;
    local_158 = "";
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_c0,&local_120,1,0,WARN,_cVar7,(size_t)&local_160,0x3d);
    boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
    }
    iVar1 = (int)local_d8;
    local_d8 = (size_t *)CONCAT44(local_d8._4_4_,(int)local_d8 + 1);
  } while (iVar1 < 99);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&names._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_threadnames_test_rename_threaded)
{
    std::set<std::string> names = RenameEnMasse(100);

    BOOST_CHECK_EQUAL(names.size(), 100U);

    // Names "test_thread.[n]" should exist for n = [0, 99]
    for (int i = 0; i < 100; ++i) {
        BOOST_CHECK(names.find(TEST_THREAD_NAME_BASE + ToString(i)) != names.end());
    }

}